

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O0

void __thiscall LogWriter::finish(LogWriter *this)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  reference puVar4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_RDI;
  uint *i_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  list<unsigned_int,_std::allocator<unsigned_int>_> *__range2_1;
  pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_> *cl;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *__range1_1;
  uint *i;
  const_iterator __end2;
  const_iterator __begin2;
  list<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_> *adj;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *__range1;
  map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *in_stack_ffffffffffffff68;
  _Self local_80;
  _Self local_78;
  list<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  reference local_68;
  _Self local_60;
  _Self local_58;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_50;
  uint *local_48;
  _Self local_40;
  _Self local_38;
  list<unsigned_int,_std::allocator<unsigned_int>_> *local_30;
  reference local_28;
  _Self local_20;
  _Self local_18;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_10;
  
  poVar3 = std::operator<<((ostream *)(in_RDI + 0xd),">--");
  uVar1 = *(uint *)&in_RDI[0x51]._M_node;
  *(uint *)&in_RDI[0x51]._M_node = uVar1 + 1;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar1);
  poVar3 = std::operator<<(poVar3,"--<");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_10 = in_RDI + 1;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar2 = std::operator!=(&local_18,&local_20);
    if (!bVar2) break;
    local_28 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)0x22c2d8);
    poVar3 = (ostream *)std::ostream::operator<<(in_RDI + 0xd,local_28->first);
    std::operator<<(poVar3," ->");
    local_30 = &local_28->second;
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                   ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68);
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68);
    while( true ) {
      bVar2 = std::operator!=(&local_38,&local_40);
      if (!bVar2) break;
      local_48 = std::_List_const_iterator<unsigned_int>::operator*
                           ((_List_const_iterator<unsigned_int> *)in_RDI);
      poVar3 = std::operator<<((ostream *)(in_RDI + 0xd)," ");
      std::ostream::operator<<(poVar3,*local_48);
      std::_List_const_iterator<unsigned_int>::operator++(&local_38);
    }
    std::ostream::operator<<(in_RDI + 0xd,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++(in_RDI);
  }
  poVar3 = std::operator<<((ostream *)(in_RDI + 0xd),"---");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_50 = in_RDI + 7;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar2 = std::operator!=(&local_58,&local_60);
    if (!bVar2) break;
    local_68 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)0x22c41a);
    poVar3 = (ostream *)std::ostream::operator<<(in_RDI + 0xd,local_68->first);
    std::operator<<(poVar3,":");
    local_70 = &local_68->second;
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                   ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68);
    local_80._M_node =
         (_List_node_base *)
         std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff68);
    while( true ) {
      bVar2 = std::operator!=(&local_78,&local_80);
      if (!bVar2) break;
      puVar4 = std::_List_const_iterator<unsigned_int>::operator*
                         ((_List_const_iterator<unsigned_int> *)in_RDI);
      poVar3 = std::operator<<((ostream *)(in_RDI + 0xd)," ");
      std::ostream::operator<<(poVar3,*puVar4);
      std::_List_const_iterator<unsigned_int>::operator++(&local_78);
    }
    std::ostream::operator<<(in_RDI + 0xd,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++(in_RDI);
  }
  return;
}

Assistant:

void finish() {
        logfile_ << ">--" << iteration_++ << "--<" << std::endl;

        for (const auto& adj : vertices_) {
            logfile_ << adj.first << " ->";
            for (const auto& i : adj.second) {
                logfile_ << " " << i;
            }
            logfile_ << std::endl;
        }

        logfile_ << "---" << std::endl;

        for (const auto& cl : cliques_) {
            logfile_ << cl.first << ":";
            for (const auto& i : cl.second) {
                logfile_ << " " << i;
            }
            logfile_ << std::endl;
        }

    }